

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

unsigned_long __thiscall tetgenmesh::randomnation(tetgenmesh *this,uint choices)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (ulong)choices;
  uVar3 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
  if (0xae528 < choices) {
    uVar2 = (uVar3 * 0x556 + 0x24d69) % 0xae529;
    this->randomseed = uVar2;
    uVar2 = (uVar1 / 0xae529) * uVar3 + uVar2;
    uVar3 = 0;
    if (uVar1 <= uVar2) {
      uVar3 = uVar1;
    }
    return uVar2 - uVar3;
  }
  this->randomseed = uVar3;
  return uVar3 % uVar1;
}

Assistant:

unsigned long tetgenmesh::randomnation(unsigned int choices)
{
  unsigned long newrandom;

  if (choices >= 714025l) {
    newrandom = (randomseed * 1366l + 150889l) % 714025l;
    randomseed = (newrandom * 1366l + 150889l) % 714025l;
    newrandom = newrandom * (choices / 714025l) + randomseed;
    if (newrandom >= choices) {
      return newrandom - choices;
    } else {
      return newrandom;
    }
  } else {
    randomseed = (randomseed * 1366l + 150889l) % 714025l;
    return randomseed % choices;
  }
}